

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::update_cohomology_groups_edge
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_handle *sigma)

{
  Filtration_simplex_base FVar1;
  Filtration_simplex_base FVar2;
  float fVar3;
  float fVar4;
  int *piVar5;
  __buckets_ptr pp_Var6;
  _Hash_node_base *p_Var7;
  pointer pvVar8;
  uint *puVar9;
  uint *puVar10;
  mapped_type *pmVar11;
  uint uVar12;
  ulong uVar13;
  Filtration_value *pFVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  __node_base_ptr p_Var19;
  __node_base_ptr p_Var20;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> __it;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> __it_00;
  bool bVar21;
  Simplex_key ku;
  Simplex_key kv;
  uint local_70;
  uint local_6c;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  *local_68;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *local_58;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_50;
  size_type local_48;
  __node_base local_40;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *local_38;
  
  local_38 = sigma->m_ptr;
  local_68 = sigma;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::endpoints
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&stack0xffffffffffffffb0,
             (Simplex_handle *)this->cpx_);
  uVar16 = ((local_50.m_ptr)->second).super_Key_simplex_base.key_;
  uVar13 = (ulong)uVar16;
  puVar9 = (this->dsets_).parent;
  uVar15 = puVar9[uVar13];
  uVar17 = uVar15;
  local_70 = uVar15;
  if (uVar15 != uVar16) {
    do {
      local_70 = puVar9[uVar17];
      bVar21 = local_70 != uVar17;
      uVar17 = local_70;
    } while (bVar21);
  }
  for (; local_70 != uVar15; uVar15 = puVar9[uVar15]) {
    puVar9[uVar13] = local_70;
    uVar13 = (ulong)uVar15;
  }
  uVar13 = (ulong)*(uint *)(local_48 + 0xc);
  uVar16 = puVar9[uVar13];
  local_6c = uVar16;
  uVar15 = uVar16;
  if (uVar16 != *(uint *)(local_48 + 0xc)) {
    do {
      local_6c = puVar9[uVar15];
      bVar21 = local_6c != uVar15;
      uVar15 = local_6c;
    } while (bVar21);
  }
  for (; local_6c != uVar16; uVar16 = puVar9[uVar16]) {
    puVar9[uVar13] = local_6c;
    uVar13 = (ulong)uVar16;
  }
  uVar13 = (ulong)local_70;
  if (local_70 == local_6c) {
    if (this->dim_max_ < 2) {
      return;
    }
    local_40._M_nxt = (_Hash_node_base *)local_68->m_ptr;
    create_cocycle(this,(Simplex_handle *)&stack0xffffffffffffffc0,1,(this->coeff_field_).Prime);
    return;
  }
  uVar16 = puVar9[uVar13];
  uVar15 = uVar16;
  uVar17 = uVar16;
  if (uVar16 != local_70) {
    do {
      uVar15 = puVar9[uVar17];
      bVar21 = uVar15 != uVar17;
      uVar17 = uVar15;
    } while (bVar21);
  }
  piVar5 = (this->dsets_).rank;
  for (; uVar15 != uVar16; uVar16 = puVar9[uVar16]) {
    puVar9[uVar13] = uVar15;
    uVar13 = (ulong)uVar16;
  }
  uVar16 = puVar9[local_6c];
  uVar12 = local_6c;
  uVar17 = uVar16;
  uVar18 = uVar16;
  if (uVar16 != local_6c) {
    do {
      uVar17 = puVar9[uVar18];
      bVar21 = uVar17 != uVar18;
      uVar18 = uVar17;
    } while (bVar21);
  }
  for (; uVar17 != uVar16; uVar16 = puVar9[uVar16]) {
    puVar9[uVar12] = uVar17;
    uVar12 = uVar16;
  }
  if (uVar15 != uVar17) {
    if (piVar5[uVar17] < piVar5[uVar15]) {
      puVar9[uVar17] = uVar15;
    }
    else {
      puVar9[uVar15] = uVar17;
      if (piVar5[uVar15] == piVar5[uVar17]) {
        piVar5[uVar17] = piVar5[uVar17] + 1;
      }
    }
  }
  pp_Var6 = (this->zero_cocycles_)._M_h._M_buckets;
  uVar13 = (this->zero_cocycles_)._M_h._M_bucket_count;
  p_Var19 = pp_Var6[(ulong)local_70 % uVar13];
  p_Var20 = (__node_base_ptr)0x0;
  if ((p_Var19 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var19->_M_nxt, p_Var20 = p_Var19, local_70 != *(uint *)&p_Var19->_M_nxt[1]._M_nxt))
  {
    while (p_Var19 = p_Var7, p_Var7 = p_Var19->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var20 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar13 != (ulong)local_70 % uVar13) ||
         (p_Var20 = p_Var19, local_70 == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_00115d49;
    }
    p_Var20 = (__node_base_ptr)0x0;
  }
LAB_00115d49:
  if (p_Var20 == (__node_base_ptr)0x0) {
    __it_00._M_cur = (__node_type *)0x0;
  }
  else {
    __it_00._M_cur = (__node_type *)p_Var20->_M_nxt;
  }
  puVar9 = (uint *)((long)__it_00._M_cur + 0xc);
  if (__it_00._M_cur == (__node_type *)0x0) {
    puVar9 = &local_70;
  }
  uVar16 = *puVar9;
  p_Var19 = pp_Var6[(ulong)local_6c % uVar13];
  p_Var20 = (__node_base_ptr)0x0;
  if ((p_Var19 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var19->_M_nxt, p_Var20 = p_Var19, local_6c != *(uint *)&p_Var19->_M_nxt[1]._M_nxt))
  {
    while (p_Var19 = p_Var7, p_Var7 = p_Var19->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var20 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar13 != (ulong)local_6c % uVar13) ||
         (p_Var20 = p_Var19, local_6c == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_00115dbe;
    }
    p_Var20 = (__node_base_ptr)0x0;
  }
LAB_00115dbe:
  if (p_Var20 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var20->_M_nxt;
  }
  local_60 = &(this->zero_cocycles_)._M_h;
  puVar9 = &local_6c;
  puVar10 = (uint *)((long)__it._M_cur + 0xc);
  if (__it._M_cur == (__node_type *)0x0) {
    puVar10 = puVar9;
  }
  uVar15 = *puVar10;
  pvVar8 = (this->cpx_->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar14 = (Filtration_value *)&(pvVar8[uVar16].m_ptr)->second;
  if (pvVar8[uVar16].m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar14 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  FVar1.filt_ = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                   *)pFVar14)->super_Filtration_simplex_base).filt_;
  pFVar14 = (Filtration_value *)&(pvVar8[uVar15].m_ptr)->second;
  if (pvVar8[uVar15].m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar14 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  FVar2.filt_ = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                   *)pFVar14)->super_Filtration_simplex_base).filt_;
  pFVar14 = (Filtration_value *)&local_68->m_ptr->second;
  if (local_68->m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar14 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar3 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
             *)pFVar14)->super_Filtration_simplex_base).filt_;
  fVar4 = (this->interval_length_policy).min_length_;
  if (FVar2.filt_ <= FVar1.filt_) {
    if (fVar4 < fVar3 - FVar1.filt_) {
      local_50.m_ptr = pvVar8[uVar16].m_ptr;
      local_58 = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                  *)CONCAT44(local_58._4_4_,(this->coeff_field_).Prime);
      std::
      vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
      ::
      emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int>
                ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                  *)&this->persistent_pairs_,&stack0xffffffffffffffb0,local_68,(int *)&local_58);
    }
    if (local_70 != uVar16) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_60,(const_iterator)__it_00._M_cur);
    }
    puVar9 = (this->dsets_).parent;
    uVar16 = puVar9[local_70];
    uVar18 = uVar16;
    uVar12 = local_70;
    uVar17 = uVar16;
    if (uVar16 != local_70) {
      do {
        uVar17 = puVar9[uVar18];
        bVar21 = uVar17 != uVar18;
        uVar18 = uVar17;
      } while (bVar21);
    }
    while (uVar18 = uVar16, uVar17 != uVar18) {
      puVar9[uVar12] = uVar17;
      uVar12 = uVar18;
      uVar16 = puVar9[uVar18];
    }
    if (local_70 != uVar17) goto LAB_00115f91;
    puVar9 = &local_70;
    uVar16 = uVar15;
    if (local_6c != uVar15) goto LAB_00115f71;
  }
  else {
    if (fVar4 < fVar3 - FVar2.filt_) {
      local_50.m_ptr = pvVar8[uVar15].m_ptr;
      local_58 = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                  *)CONCAT44(local_58._4_4_,(this->coeff_field_).Prime);
      std::
      vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
      ::
      emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int>
                ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                  *)&this->persistent_pairs_,&stack0xffffffffffffffb0,local_68,(int *)&local_58);
    }
    if (local_6c != uVar15) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_60,(const_iterator)__it._M_cur);
    }
    puVar10 = (this->dsets_).parent;
    uVar15 = puVar10[local_6c];
    uVar18 = uVar15;
    uVar12 = local_6c;
    uVar17 = uVar15;
    if (uVar15 != local_6c) {
      do {
        uVar17 = puVar10[uVar18];
        bVar21 = uVar17 != uVar18;
        uVar18 = uVar17;
      } while (bVar21);
    }
    while (uVar18 = uVar15, uVar17 != uVar18) {
      puVar10[uVar12] = uVar17;
      uVar12 = uVar18;
      uVar15 = puVar10[uVar18];
    }
    if (local_6c != uVar17) goto LAB_00115f91;
    __it._M_cur = __it_00._M_cur;
    uVar15 = uVar16;
    if (local_70 != uVar16) {
LAB_00115f71:
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(local_60,(const_iterator)__it._M_cur);
      uVar16 = uVar15;
    }
  }
  pmVar11 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)local_60,puVar9);
  *pmVar11 = uVar16;
LAB_00115f91:
  local_58 = local_68->m_ptr;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::_to_node_it
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&stack0xffffffffffffffb0,
             (Simplex_handle *)this->cpx_);
  ((local_50.m_ptr)->second).super_Key_simplex_base.key_ = 0xffffffff;
  return;
}

Assistant:

void update_cohomology_groups_edge(Simplex_handle sigma) {
    Simplex_handle u, v;
    boost::tie(u, v) = cpx_->endpoints(sigma);

    Simplex_key ku = dsets_.find_set(cpx_->key(u));
    Simplex_key kv = dsets_.find_set(cpx_->key(v));

    if (ku != kv) {        // Destroy a connected component
      dsets_.link(ku, kv);
      // Keys of the simplices which created the connected components containing
      // respectively u and v.
      Simplex_key idx_coc_u, idx_coc_v;
      auto map_it_u = zero_cocycles_.find(ku);
      // If the index of the cocycle representing the class is already ku.
      if (map_it_u == zero_cocycles_.end()) {
        idx_coc_u = ku;
      } else {
        idx_coc_u = map_it_u->second;
      }

      auto map_it_v = zero_cocycles_.find(kv);
      // If the index of the cocycle representing the class is already kv.
      if (map_it_v == zero_cocycles_.end()) {
        idx_coc_v = kv;
      } else {
        idx_coc_v = map_it_v->second;
      }

      if (cpx_->filtration(cpx_->simplex(idx_coc_u))
          < cpx_->filtration(cpx_->simplex(idx_coc_v))) {  // Kill cocycle [idx_coc_v], which is younger.
        if (interval_length_policy(cpx_->simplex(idx_coc_v), sigma)) {
          persistent_pairs_.emplace_back(
              cpx_->simplex(idx_coc_v), sigma, coeff_field_.characteristic());
        }
        // Maintain the index of the 0-cocycle alive.
        if (kv != idx_coc_v) {
          zero_cocycles_.erase(map_it_v);
        }
        if (kv == dsets_.find_set(kv)) {
          if (ku != idx_coc_u) {
            zero_cocycles_.erase(map_it_u);
          }
          zero_cocycles_[kv] = idx_coc_u;
        }
      } else {  // Kill cocycle [idx_coc_u], which is younger.
        if (interval_length_policy(cpx_->simplex(idx_coc_u), sigma)) {
          persistent_pairs_.emplace_back(
              cpx_->simplex(idx_coc_u), sigma, coeff_field_.characteristic());
        }
        // Maintain the index of the 0-cocycle alive.
        if (ku != idx_coc_u) {
          zero_cocycles_.erase(map_it_u);
        }
        if (ku == dsets_.find_set(ku)) {
          if (kv != idx_coc_v) {
            zero_cocycles_.erase(map_it_v);
          }
          zero_cocycles_[ku] = idx_coc_v;
        }
      }
      cpx_->assign_key(sigma, cpx_->null_key());
    } else if (dim_max_ > 1) {  // If ku == kv, same connected component: create a 1-cocycle class.
      create_cocycle(sigma, coeff_field_.multiplicative_identity(), coeff_field_.characteristic());
    }
  }